

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_section_fixups.cpp
# Opt level: O0

parser<pstore::exchange::import_ns::callbacks> *
anon_unknown.dwarf_33b920::ExternalFixupMembersImport::parse
          (parser<pstore::exchange::import_ns::callbacks> *__return_storage_ptr__,string *src,
          database *db,string_mapping *names)

{
  pointer names_00;
  not_null<external_fixup_collection_*> local_48;
  undefined1 local_40 [8];
  external_fixup_collection fixups;
  string_mapping *names_local;
  database *db_local;
  string *src_local;
  
  fixups.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)names;
  std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>::vector
            ((vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_> *)
             local_40);
  names_00 = fixups.
             super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pstore::gsl::
  not_null<std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_*>
  ::not_null(&local_48,
             (vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_> *)
             local_40);
  parse(__return_storage_ptr__,src,db,(string_mapping *)names_00,local_48);
  std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>::~vector
            ((vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_> *)
             local_40);
  return __return_storage_ptr__;
}

Assistant:

static decltype (auto) parse (std::string const & src, pstore::database * const db,
                                      pstore::exchange::import_ns::string_mapping const & names) {
            external_fixup_collection fixups;
            return parse (src, db, names, &fixups);
        }